

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient> *this,void *pointer)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  PromiseArenaMember *node;
  long *plVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  undefined8 *puVar13;
  
  if (pointer != (void *)0x0) {
    puVar13 = *(undefined8 **)((long)pointer + 0x88);
    puVar1 = *(undefined8 **)((long)pointer + 0x98);
    plVar2 = *(long **)((long)pointer + 0xa0);
    puVar3 = *(undefined8 **)((long)pointer + 0xa8);
    puVar11 = *(undefined8 **)((long)pointer + 0xb0);
    plVar4 = *(long **)((long)pointer + 0xc0);
    plVar9 = plVar2;
    while (plVar9 = plVar9 + 1, plVar9 < plVar4) {
      lVar5 = *plVar9;
      lVar12 = 8;
      do {
        plVar6 = *(long **)(lVar5 + lVar12);
        if (plVar6 != (long *)0x0) {
          *(undefined8 *)(lVar5 + lVar12) = 0;
          puVar7 = *(undefined8 **)(lVar5 + -8 + lVar12);
          (**(code **)*puVar7)(puVar7,(long)plVar6 + *(long *)(*plVar6 + -0x10));
        }
        lVar12 = lVar12 + 0x18;
      } while (lVar12 != 0x200);
    }
    if (plVar2 == plVar4) {
      for (; puVar13 != puVar3; puVar13 = puVar13 + 3) {
        plVar2 = (long *)puVar13[1];
        if (plVar2 != (long *)0x0) {
          puVar13[1] = 0;
          (*(code *)**(undefined8 **)*puVar13)
                    ((undefined8 *)*puVar13,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
    }
    else {
      for (; puVar13 != puVar1; puVar13 = puVar13 + 3) {
        plVar2 = (long *)puVar13[1];
        if (plVar2 != (long *)0x0) {
          puVar13[1] = 0;
          (*(code *)**(undefined8 **)*puVar13)
                    ((undefined8 *)*puVar13,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
      for (; puVar11 != puVar3; puVar11 = puVar11 + 3) {
        plVar2 = (long *)puVar11[1];
        if (plVar2 != (long *)0x0) {
          puVar11[1] = 0;
          (*(code *)**(undefined8 **)*puVar11)
                    ((undefined8 *)*puVar11,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        }
      }
    }
    if (*(long *)((long)pointer + 0x78) != 0) {
      uVar8 = *(ulong *)((long)pointer + 0xc0);
      if (*(ulong *)((long)pointer + 0xa0) < uVar8 + 8) {
        uVar10 = *(ulong *)((long)pointer + 0xa0) - 8;
        do {
          puVar13 = (undefined8 *)(uVar10 + 8);
          uVar10 = uVar10 + 8;
          operator_delete((void *)*puVar13,0x1f8);
        } while (uVar10 < uVar8);
      }
      operator_delete(*(void **)((long)pointer + 0x78),*(long *)((long)pointer + 0x80) << 3);
    }
    node = *(PromiseArenaMember **)((long)pointer + 0x70);
    if (node != (PromiseArenaMember *)0x0) {
      *(undefined8 *)((long)pointer + 0x70) = 0;
      PromiseDisposer::dispose(node);
    }
    plVar2 = *(long **)((long)pointer + 0x60);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x60) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x58))
                (*(undefined8 **)((long)pointer + 0x58),(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = *(long **)((long)pointer + 0x20);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x20) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x18))
                (*(undefined8 **)((long)pointer + 0x18),(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    operator_delete(pointer,200);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }